

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O0

bool net_uv::net_compareAddress(sockaddr *addr1,sockaddr *addr2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  sockaddr_in *addr_in_2;
  sockaddr_in *addr_in_1;
  sockaddr_in6 *addr2_6;
  sockaddr_in6 *addr1_6;
  sockaddr *addr2_local;
  sockaddr *addr1_local;
  
  if ((addr1 == (sockaddr *)0x0) || (addr2 == (sockaddr *)0x0)) {
    addr1_local._7_1_ = false;
  }
  else if (addr1 == addr2) {
    addr1_local._7_1_ = true;
  }
  else if (addr1->sa_family == addr2->sa_family) {
    if (addr1->sa_family == 10) {
      if (*(short *)addr1->sa_data == *(short *)addr2->sa_data) {
        cVar7 = -(addr1->sa_data[6] == addr2->sa_data[6]);
        cVar8 = -(addr1->sa_data[7] == addr2->sa_data[7]);
        cVar9 = -(addr1->sa_data[8] == addr2->sa_data[8]);
        cVar10 = -(addr1->sa_data[9] == addr2->sa_data[9]);
        cVar11 = -(addr1->sa_data[10] == addr2->sa_data[10]);
        cVar12 = -(addr1->sa_data[0xb] == addr2->sa_data[0xb]);
        cVar13 = -(addr1->sa_data[0xc] == addr2->sa_data[0xc]);
        cVar14 = -(addr1->sa_data[0xd] == addr2->sa_data[0xd]);
        cVar15 = -((char)addr1[1].sa_family == (char)addr2[1].sa_family);
        cVar16 = -(*(char *)((long)&addr1[1].sa_family + 1) ==
                  *(char *)((long)&addr2[1].sa_family + 1));
        cVar17 = -(addr1[1].sa_data[0] == addr2[1].sa_data[0]);
        cVar18 = -(addr1[1].sa_data[1] == addr2[1].sa_data[1]);
        cVar19 = -(addr1[1].sa_data[2] == addr2[1].sa_data[2]);
        cVar20 = -(addr1[1].sa_data[3] == addr2[1].sa_data[3]);
        cVar21 = -(addr1[1].sa_data[4] == addr2[1].sa_data[4]);
        bVar22 = -(addr1[1].sa_data[5] == addr2[1].sa_data[5]);
        auVar1[1] = cVar8;
        auVar1[0] = cVar7;
        auVar1[2] = cVar9;
        auVar1[3] = cVar10;
        auVar1[4] = cVar11;
        auVar1[5] = cVar12;
        auVar1[6] = cVar13;
        auVar1[7] = cVar14;
        auVar1[8] = cVar15;
        auVar1[9] = cVar16;
        auVar1[10] = cVar17;
        auVar1[0xb] = cVar18;
        auVar1[0xc] = cVar19;
        auVar1[0xd] = cVar20;
        auVar1[0xe] = cVar21;
        auVar1[0xf] = bVar22;
        auVar2[1] = cVar8;
        auVar2[0] = cVar7;
        auVar2[2] = cVar9;
        auVar2[3] = cVar10;
        auVar2[4] = cVar11;
        auVar2[5] = cVar12;
        auVar2[6] = cVar13;
        auVar2[7] = cVar14;
        auVar2[8] = cVar15;
        auVar2[9] = cVar16;
        auVar2[10] = cVar17;
        auVar2[0xb] = cVar18;
        auVar2[0xc] = cVar19;
        auVar2[0xd] = cVar20;
        auVar2[0xe] = cVar21;
        auVar2[0xf] = bVar22;
        auVar6[1] = cVar10;
        auVar6[0] = cVar9;
        auVar6[2] = cVar11;
        auVar6[3] = cVar12;
        auVar6[4] = cVar13;
        auVar6[5] = cVar14;
        auVar6[6] = cVar15;
        auVar6[7] = cVar16;
        auVar6[8] = cVar17;
        auVar6[9] = cVar18;
        auVar6[10] = cVar19;
        auVar6[0xb] = cVar20;
        auVar6[0xc] = cVar21;
        auVar6[0xd] = bVar22;
        auVar5[1] = cVar11;
        auVar5[0] = cVar10;
        auVar5[2] = cVar12;
        auVar5[3] = cVar13;
        auVar5[4] = cVar14;
        auVar5[5] = cVar15;
        auVar5[6] = cVar16;
        auVar5[7] = cVar17;
        auVar5[8] = cVar18;
        auVar5[9] = cVar19;
        auVar5[10] = cVar20;
        auVar5[0xb] = cVar21;
        auVar5[0xc] = bVar22;
        auVar4[1] = cVar12;
        auVar4[0] = cVar11;
        auVar4[2] = cVar13;
        auVar4[3] = cVar14;
        auVar4[4] = cVar15;
        auVar4[5] = cVar16;
        auVar4[6] = cVar17;
        auVar4[7] = cVar18;
        auVar4[8] = cVar19;
        auVar4[9] = cVar20;
        auVar4[10] = cVar21;
        auVar4[0xb] = bVar22;
        auVar3[1] = cVar13;
        auVar3[0] = cVar12;
        auVar3[2] = cVar14;
        auVar3[3] = cVar15;
        auVar3[4] = cVar16;
        auVar3[5] = cVar17;
        auVar3[6] = cVar18;
        auVar3[7] = cVar19;
        auVar3[8] = cVar20;
        auVar3[9] = cVar21;
        auVar3[10] = bVar22;
        addr1_local._7_1_ =
             (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(
                                                  cVar19,CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(
                                                  cVar16,CONCAT12(cVar15,CONCAT11(cVar14,cVar13)))))
                                                  )))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(
                                                  cVar19,CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(
                                                  cVar16,CONCAT11(cVar15,cVar14)))))))) >> 7) & 1)
                      << 7 | (ushort)(bVar22 >> 7) << 0xf) == 0xffff;
      }
      else {
        addr1_local._7_1_ = false;
      }
    }
    else if (addr1->sa_family == 2) {
      if (*(short *)addr1->sa_data == *(short *)addr2->sa_data) {
        addr1_local._7_1_ = *(int *)(addr1->sa_data + 2) == *(int *)(addr2->sa_data + 2);
      }
      else {
        addr1_local._7_1_ = false;
      }
    }
    else {
      addr1_local._7_1_ = false;
    }
  }
  else {
    addr1_local._7_1_ = false;
  }
  return addr1_local._7_1_;
}

Assistant:

bool net_compareAddress(const struct sockaddr* addr1, const struct sockaddr* addr2)
{
	if (addr1 == NULL || addr2 == NULL)
		return false;

	if (addr1 == addr2)
		return true;

	if (addr1->sa_family != addr2->sa_family)
	{
		return false;
	}

	if (addr1->sa_family == AF_INET6)
	{
		const struct sockaddr_in6* addr1_6 = (const struct sockaddr_in6*) addr1;
		const struct sockaddr_in6* addr2_6 = (const struct sockaddr_in6*) addr2;

		if (addr1_6->sin6_port != addr2_6->sin6_port)
		{
			return false;
		}

		return memcmp(&addr1_6->sin6_addr, &addr2_6->sin6_addr, sizeof(addr1_6->sin6_addr)) == 0;
	}
	else if (addr1->sa_family == AF_INET)
	{
		const struct sockaddr_in* addr_in_1 = (const struct sockaddr_in*) addr1;
		const struct sockaddr_in* addr_in_2 = (const struct sockaddr_in*) addr2;

		if (addr_in_1->sin_port != addr_in_2->sin_port)
		{
			return false;
		}

		return memcmp(&addr_in_1->sin_addr, &addr_in_2->sin_addr, sizeof(addr_in_1->sin_addr)) == 0;
	}
	else
	{
		return false;
		//return memcmp(addr1, addr2, sizeof(struct sockaddr)) == 0;
	}
}